

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_init.inc.c
# Opt level: O1

void gen_spr_power6_common(CPUPPCState_conflict2 *env)

{
  undefined8 uVar1;
  undefined8 uVar2;
  
  if ((((env->spr_cb[0x11].name == (char *)0x0) && (env->spr[0x11] == 0)) &&
      (env->spr_cb[0x11].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
     (((env->spr_cb[0x11].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
       (env->spr_cb[0x11].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
      (env->spr_cb[0x11].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))) {
    env->spr_cb[0x11].name = "SPR_DSCR";
    env->spr_cb[0x11].uea_read = spr_noaccess;
    env->spr_cb[0x11].uea_write = spr_noaccess;
    env->spr_cb[0x11].oea_read = spr_read_generic;
    env->spr_cb[0x11].oea_write = spr_write_generic;
    env->spr_cb[0x11].hea_read = spr_read_generic;
    env->spr_cb[0x11].hea_write = spr_write_generic;
    env->spr_cb[0x11].default_value = 0;
    env->spr[0x11] = 0;
    if (((env->spr_cb[0x152].name == (char *)0x0) && (env->spr[0x152] == 0)) &&
       ((env->spr_cb[0x152].oea_read == (_func_void_DisasContext_ptr_int_int *)0x0 &&
        (((env->spr_cb[0x152].oea_write == (_func_void_DisasContext_ptr_int_int *)0x0 &&
          (env->spr_cb[0x152].uea_read == (_func_void_DisasContext_ptr_int_int *)0x0)) &&
         (env->spr_cb[0x152].uea_write == (_func_void_DisasContext_ptr_int_int *)0x0)))))) {
      env->spr_cb[0x152].name = "PCR";
      env->spr_cb[0x152].uea_read = spr_noaccess;
      env->spr_cb[0x152].uea_write = spr_noaccess;
      env->spr_cb[0x152].oea_read = spr_noaccess;
      env->spr_cb[0x152].oea_write = spr_noaccess;
      env->spr_cb[0x152].hea_read = spr_read_generic;
      env->spr_cb[0x152].hea_write = spr_write_pcr;
      env->spr_cb[0x152].default_value = 0;
      env->spr[0x152] = 0;
      return;
    }
    uVar2 = 0x152;
    uVar1 = 0x152;
  }
  else {
    uVar2 = 0x11;
    uVar1 = 0x11;
  }
  printf("Error: Trying to register SPR %d (%03x) twice !\n",uVar2,uVar1);
  exit(1);
}

Assistant:

static void gen_spr_power6_common(CPUPPCState *env)
{
    spr_register_kvm(env, SPR_DSCR, "SPR_DSCR",
                     SPR_NOACCESS, SPR_NOACCESS,
                     &spr_read_generic, &spr_write_generic,
                     KVM_REG_PPC_DSCR, 0x00000000);
    /*
     * Register PCR to report POWERPC_EXCP_PRIV_REG instead of
     * POWERPC_EXCP_INVAL_SPR in userspace. Permit hypervisor access.
     */
    spr_register_hv(env, SPR_PCR, "PCR",
                 SPR_NOACCESS, SPR_NOACCESS,
                 SPR_NOACCESS, SPR_NOACCESS,
                 &spr_read_generic, &spr_write_pcr,
                 0x00000000);
}